

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O1

SPxId __thiscall
soplex::SPxSteepPR<double>::buildBestPriceVectorEnterDim
          (SPxSteepPR<double> *this,double *best,double feastol)

{
  pointer *ppIVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  SPxSolverBase<double> *pSVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pIVar9;
  int *piVar10;
  iterator __position;
  IdxElement *keys;
  uint uVar11;
  DataKey DVar12;
  long lVar13;
  double dVar14;
  IdxElement price;
  
  pSVar6 = (this->super_SPxPricer<double>).thesolver;
  pdVar7 = (pSVar6->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar8 = (pSVar6->coWeights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pIVar9 = (this->prices).data.
           super__Vector_base<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->prices).data.
      super__Vector_base<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
      ._M_impl.super__Vector_impl_data._M_finish != pIVar9) {
    (this->prices).data.
    super__Vector_base<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar9;
  }
  (this->bestPrices).super_IdxSet.num = 0;
  lVar13 = (long)(pSVar6->infeasibilities).super_IdxSet.num;
  if (0 < lVar13) {
    lVar13 = lVar13 + 1;
    do {
      pSVar6 = (this->super_SPxPricer<double>).thesolver;
      piVar10 = (pSVar6->infeasibilities).super_IdxSet.idx;
      iVar4 = piVar10[lVar13 + -2];
      dVar2 = pdVar7[iVar4];
      if (-feastol <= dVar2) {
        iVar5 = (pSVar6->infeasibilities).super_IdxSet.num;
        (pSVar6->infeasibilities).super_IdxSet.num = iVar5 + -1;
        piVar10[lVar13 + -2] = piVar10[(long)iVar5 + -1];
        (pSVar6->isInfeasible).data[iVar4] = 0;
      }
      else {
        (pSVar6->isInfeasible).data[iVar4] = 1;
        dVar3 = pdVar8[iVar4];
        dVar14 = feastol;
        if (feastol <= dVar3) {
          dVar14 = dVar3;
        }
        price.val = (dVar2 * dVar2) / dVar14;
        __position._M_current =
             (this->prices).data.
             super__Vector_base<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        price.idx = iVar4;
        if (__position._M_current ==
            (this->prices).data.
            super__Vector_base<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<soplex::SPxPricer<double>::IdxElement,std::allocator<soplex::SPxPricer<double>::IdxElement>>
          ::_M_realloc_insert<soplex::SPxPricer<double>::IdxElement_const&>
                    ((vector<soplex::SPxPricer<double>::IdxElement,std::allocator<soplex::SPxPricer<double>::IdxElement>>
                      *)&this->prices,__position,&price);
        }
        else {
          *(ulong *)__position._M_current = CONCAT44(price._4_4_,iVar4);
          (__position._M_current)->val = price.val;
          ppIVar1 = &(this->prices).data.
                     super__Vector_base<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppIVar1 = *ppIVar1 + 1;
        }
      }
      lVar13 = lVar13 + -1;
    } while (1 < lVar13);
  }
  keys = (this->prices).data.
         super__Vector_base<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
         ._M_impl.super__Vector_impl_data._M_start;
  pIVar9 = (this->prices).data.
           super__Vector_base<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->super_SPxPricer<double>).compare.elements = keys;
  uVar11 = SPxQuicksortPart<soplex::SPxPricer<double>::IdxElement,soplex::SPxPricer<double>::IdxCompare>
                     (keys,&(this->super_SPxPricer<double>).compare,0,
                      (int)((ulong)((long)pIVar9 - (long)keys) >> 4),100,0,0,true);
  if (0 < (int)uVar11) {
    lVar13 = 0;
    do {
      DIdxSet::addIdx(&this->bestPrices,
                      *(int *)((long)&((this->prices).data.
                                       super__Vector_base<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->idx + lVar13));
      (((this->super_SPxPricer<double>).thesolver)->isInfeasible).data
      [*(int *)((long)&((this->prices).data.
                        super__Vector_base<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
                        ._M_impl.super__Vector_impl_data._M_start)->idx + lVar13)] = 2;
      lVar13 = lVar13 + 0x10;
    } while ((ulong)uVar11 << 4 != lVar13);
  }
  if ((int)uVar11 < 1) {
    DVar12.info = 0;
    DVar12.idx = -1;
  }
  else {
    pIVar9 = (this->prices).data.
             super__Vector_base<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *best = pIVar9->val;
    DVar12 = (DataKey)SPxSolverBase<double>::coId
                                ((this->super_SPxPricer<double>).thesolver,pIVar9->idx);
  }
  return (SPxId)DVar12;
}

Assistant:

SPxId SPxSteepPR<R>::buildBestPriceVectorEnterDim(R& best, R feastol)
{
   const R* coTest        = this->thesolver->coTest().get_const_ptr();
   const R* coWeights_ptr = this->thesolver->coWeights.get_const_ptr();
   int idx;
   int nsorted;
   R x;
   typename SPxPricer<R>::IdxElement price;

   prices.clear();
   bestPrices.clear();

   // construct vector of all prices
   for(int i = this->thesolver->infeasibilities.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilities.index(i);
      x = coTest[idx];

      if(x < -feastol)
      {
         // it might happen that we call the pricer with a tighter tolerance than what was used when computing the violations
         this->thesolver->isInfeasible[idx] = this->VIOLATED;
         price.val = steeppr::computePrice(x, coWeights_ptr[idx], feastol);
         price.idx = idx;
         prices.append(price);
      }
      else
      {
         this->thesolver->infeasibilities.remove(i);
         this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
      }
   }

#ifndef NDEBUG

   if(std::is_floating_point<R>::value)
   {
      for(int i = 0; i < prices.size(); ++i)
      {
         // nan values cannot be handled in sorting
         assert(!isnan(prices[i].val));
         // inf values indicate numerical troubles, which should be handled beforehand
         assert(!isinf(prices[i].val));
      }
   }

#endif

   // set up structures for the quicksort implementation
   this->compare.elements = prices.get_const_ptr();
   // do a partial sort to move the best ones to the front
   // TODO this can be done more efficiently, since we only need the indices
   nsorted = SPxQuicksortPart(prices.get_ptr(), this->compare, 0, prices.size(),
                              SOPLEX_HYPERPRICINGSIZE);

   // copy indices of best values to bestPrices
   for(int i = 0; i < nsorted; ++i)
   {
      bestPrices.addIdx(prices[i].idx);
      this->thesolver->isInfeasible[prices[i].idx] = this->VIOLATED_AND_CHECKED;
   }

   if(nsorted > 0)
   {
      best = prices[0].val;
      return this->thesolver->coId(prices[0].idx);
   }
   else
      return SPxId();
}